

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTAudioEngine_Pause(FACTAudioEngine *pEngine,uint16_t nCategory,int32_t fPause)

{
  ushort uVar1;
  short sVar2;
  LinkedList *pLVar3;
  ulong uVar4;
  FACTCue *pCue;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  pLVar3 = pEngine->sbList;
  do {
    if (pLVar3 == (LinkedList *)0x0) {
      FAudio_PlatformUnlockMutex(pEngine->apiLock);
      return 0;
    }
    for (pCue = *(FACTCue **)((long)pLVar3->entry + 8); pCue != (FACTCue *)0x0; pCue = pCue->next) {
      if (pCue->playingSound != (FACTSoundInstance *)0x0) {
        uVar1 = pCue->playingSound->sound->category;
        uVar4 = (ulong)uVar1;
        if (uVar1 == nCategory) {
LAB_0010b878:
          FACTCue_Pause(pCue,fPause);
        }
        else {
          while (sVar2 = pEngine->categories[uVar4].parentCategory, sVar2 != -1) {
            if ((int)sVar2 == (uint)nCategory) goto LAB_0010b878;
            uVar4 = (ulong)sVar2;
          }
        }
      }
    }
    pLVar3 = pLVar3->next;
  } while( true );
}

Assistant:

uint32_t FACTAudioEngine_Pause(
	FACTAudioEngine *pEngine,
	uint16_t nCategory,
	int32_t fPause
) {
	FACTCue *cue;
	LinkedList *list;

	FAudio_PlatformLockMutex(pEngine->apiLock);
	list = pEngine->sbList;
	while (list != NULL)
	{
		cue = ((FACTSoundBank*) list->entry)->cueList;
		while (cue != NULL)
		{
			if (	cue->playingSound != NULL &&
				FACT_INTERNAL_IsInCategory(
					pEngine,
					nCategory,
					cue->playingSound->sound->category
				)	)
			{
				FACTCue_Pause(cue, fPause);
			}
			cue = cue->next;
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}